

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmGen11TextureCalc::FillPlanarOffsetAddress
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  long lVar1;
  long lVar2;
  GMM_RESOURCE_FORMAT GVar3;
  uint uVar4;
  GMM_TILE_MODE GVar5;
  anon_struct_8_45_9b07292e_for_Gpu aVar6;
  Context *pCVar7;
  PlatformInfo *pPVar8;
  int iVar9;
  GMM_GFX_SIZE_T *pGVar10;
  uint32_t uVar11;
  GMM_PLATFORM_INFO *pGVar12;
  ulong uVar13;
  byte bVar14;
  uint32_t NumSamples;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  GMM_GFX_SIZE_T *pGVar19;
  GMM_GFX_SIZE_T *pGVar20;
  GMM_GFX_SIZE_T *pGVar21;
  int iVar22;
  GMM_GFX_SIZE_T *pGVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  GMM_GFX_SIZE_T *local_38;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return;
  }
  if (TILE__64_2D_16X_128bpe < pTexInfo->TileMode) {
    return;
  }
  uVar25 = pTexInfo->BitsPerPixel * (int)pTexInfo->BaseWidth;
  pGVar12 = GmmGetPlatformInfo((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                               super_GmmTextureCalc.pGmmLibContext);
  bVar27 = false;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[1] = 0;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] = 0;
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9] = 0;
  uVar11 = pTexInfo->BaseHeight;
  aVar6 = (pTexInfo->Flags).Gpu;
  if (((ulong)aVar6 >> 0x29 & 1) != 0) {
    if (((ulong)aVar6 & 0x20000040) == 0) {
      NumSamples = 1;
    }
    else {
      NumSamples = (pTexInfo->MSAA).NumSamples;
    }
    uVar11 = GmmTextureCalc::ExpandHeight
                       ((GmmTextureCalc *)this,uVar11,(pTexInfo->Alignment).VAlign,NumSamples);
    uVar11 = (*(this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
               _vptr_GmmTextureCalc[0x17])(this,pTexInfo,(ulong)uVar11);
    if (((ulong)(pTexInfo->Flags).Gpu & 0x2000000000) != 0) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] = 0;
    }
  }
  pGVar21 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 2;
  pGVar19 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 6;
  pGVar23 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 3;
  local_38 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 7;
  GVar3 = pTexInfo->Format;
  switch(GVar3) {
  case GMM_FORMAT_I420:
  case GMM_FORMAT_IYUV:
    pGVar10 = local_38;
    pGVar20 = pGVar23;
    pGVar23 = pGVar21;
    local_38 = pGVar19;
    goto LAB_001b3e9a;
  case GMM_FORMAT_IMC1:
    pGVar10 = pGVar19;
    pGVar19 = local_38;
    pGVar20 = pGVar23;
    pGVar23 = pGVar21;
    goto LAB_001b3fcd;
  case GMM_FORMAT_IMC2:
    pGVar10 = pGVar19;
    pGVar19 = local_38;
    pGVar20 = pGVar23;
    pGVar23 = pGVar21;
    goto LAB_001b400e;
  case GMM_FORMAT_IMC3:
  case GMM_FORMAT_MFX_JPEG_YUV420:
  case GMM_FORMAT_MFX_JPEG_YUV422V:
    pGVar10 = local_38;
    pGVar20 = pGVar21;
LAB_001b3fcd:
    local_38 = pGVar10;
    bVar27 = false;
    *pGVar20 = 0;
    uVar11 = pTexInfo->BaseHeight;
    uVar15 = uVar11 + 0xf & 0xfffffff0;
    uVar13 = (ulong)uVar15;
    *pGVar19 = uVar13;
    *pGVar23 = 0;
    uVar25 = (uVar11 + 1 >> 1) + 0xf & 0xfffffff0;
    *local_38 = (ulong)(uVar25 + uVar15);
    uVar16 = (ulong)uVar25;
    pGVar21 = pGVar20;
    break;
  case GMM_FORMAT_IMC4:
    pGVar10 = local_38;
    pGVar20 = pGVar21;
LAB_001b400e:
    local_38 = pGVar10;
    *pGVar20 = 0;
    uVar25 = pTexInfo->BaseHeight + 0xf & 0xfffffff0;
    uVar13 = (ulong)uVar25;
    *pGVar19 = uVar13;
    *pGVar23 = pTexInfo->Pitch >> 1;
    *local_38 = uVar13;
    bVar27 = true;
    uVar16 = (ulong)(uVar25 >> 1);
    pGVar21 = pGVar20;
    break;
  case GMM_FORMAT_L4A4:
  case GMM_FORMAT_P8:
  case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
  case GMM_FORMAT_R24G8_TYPELESS:
  case GMM_FORMAT_R32G8X24_TYPELESS:
  case GMM_FORMAT_RENDER_8BIT:
  case GMM_FORMAT_Y1_UNORM:
  case GMM_FORMAT_Y8_UNORM_VA:
  case GMM_FORMAT_Y16_SNORM:
  case GMM_FORMAT_Y16_UNORM:
  case GMM_FORMAT_Y32_UNORM:
  case GMM_FORMAT_Y210:
  case GMM_FORMAT_Y212:
  case GMM_FORMAT_Y410:
  case GMM_FORMAT_Y412:
  case GMM_FORMAT_Y216:
  case GMM_FORMAT_Y416:
  case GMM_FORMAT_UYVY_2x1:
  case GMM_FORMAT_VYUY_2x1:
  case GMM_FORMAT_YUY2_2x1:
  case GMM_FORMAT_YVYU_2x1:
  case GMM_FORMAT_MEDIA_Y1_UNORM:
  case GMM_FORMAT_MEDIA_Y8_UNORM:
  case GMM_FORMAT_MEDIA_Y16_SNORM:
  case GMM_FORMAT_MEDIA_Y16_UNORM:
  case GMM_FORMAT_MEDIA_Y32_UNORM:
  case GMM_FORMAT_B16G16R16A16_UNORM:
    goto switchD_001b3e19_caseD_155;
  case GMM_FORMAT_MFX_JPEG_YUV411:
  case GMM_FORMAT_MFX_JPEG_YUV422H:
  case GMM_FORMAT_MFX_JPEG_YUV444:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3] = 0;
    uVar25 = pTexInfo->BaseHeight + 0xf & 0xfffffff0;
    uVar13 = (ulong)uVar25;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[6] = uVar13;
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x40) = (ulong)(uVar25 * 2);
    goto LAB_001b3f6c;
  case GMM_FORMAT_MFX_JPEG_YUV411R:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3] = 0;
    uVar11 = pTexInfo->BaseHeight;
    uVar15 = uVar11 + 0xf & 0xfffffff0;
    uVar13 = (ulong)uVar15;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[6] = uVar13;
    uVar25 = (uVar11 + 3 >> 2) + 0xf & 0xfffffff0;
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x40) = (ulong)(uVar25 + uVar15);
    bVar27 = false;
    uVar16 = (ulong)uVar25;
    break;
  case GMM_FORMAT_NV11:
  case GMM_FORMAT_NV12:
  case GMM_FORMAT_NV21:
  case GMM_FORMAT_P010:
  case GMM_FORMAT_P012:
  case GMM_FORMAT_P016:
  case GMM_FORMAT_P208:
  case GMM_FORMAT_P216:
    uVar13 = (ulong)(uVar11 + 1 & 0xfffffffe);
    *pGVar21 = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[3] = 0;
    *local_38 = uVar13;
    *pGVar19 = uVar13;
    bVar27 = true;
    uVar16 = uVar13;
    if ((GVar3 - GMM_FORMAT_NV12 < 6) && (GVar3 - GMM_FORMAT_NV12 != 2)) {
      uVar16 = (ulong)(uVar11 + 1 >> 1);
    }
    break;
  case GMM_FORMAT_RGBP:
switchD_001b3e19_caseD_168:
    uVar25 = *(uint *)&(pTexInfo->Flags).Info;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[2] = 0;
    uVar15 = pTexInfo->BaseHeight;
    if ((uVar25 >> 0x13 & 1) == 0) {
      uVar15 = uVar15 + 0xf & 0xfffffff0;
    }
    uVar13 = (ulong)uVar15;
    *pGVar19 = uVar13;
    *pGVar23 = 0;
    *local_38 = uVar13 * 2;
LAB_001b3f6c:
    bVar27 = false;
    uVar16 = uVar13;
    break;
  case GMM_FORMAT_YV12:
  case GMM_FORMAT_YVU9:
    pGVar10 = pGVar19;
    pGVar20 = pGVar21;
LAB_001b3e9a:
    pGVar19 = pGVar10;
    uVar13 = pTexInfo->Pitch;
    uVar4 = pTexInfo->BaseHeight;
    iVar22 = uVar4 * (int)uVar13;
    bVar27 = GVar3 == GMM_FORMAT_YVU9;
    uVar15 = (uint)!bVar27 * 2 | 0xfffffffc;
    uVar17 = (uVar4 + 1 + (uint)bVar27 * 2 & uVar15) * ((int)uVar13 + 1 + (uint)bVar27 * 2 & uVar15)
             >> bVar27 * '\x02' + 2;
    uVar15 = uVar17 + iVar22;
    *pGVar23 = 0;
    *local_38 = (ulong)uVar4;
    *pGVar20 = (ulong)uVar15 % uVar13;
    *pGVar19 = uVar15 / uVar13;
    iVar9 = uVar17 * 2;
    pGVar21 = pGVar20;
    if (uVar25 < 8) {
      uVar13 = (ulong)(uint)(iVar9 + iVar22);
      bVar27 = false;
      uVar16 = 0;
    }
    else {
      uVar25 = uVar25 >> 3;
      uVar13 = (ulong)(iVar9 + -1 + iVar22 + uVar25) / (ulong)uVar25;
      bVar27 = false;
      uVar16 = 0;
    }
    break;
  default:
    if (GVar3 == GMM_FORMAT_BGRP) goto switchD_001b3e19_caseD_168;
    goto switchD_001b3e19_caseD_155;
  }
LAB_001b4038:
  (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9] = uVar13;
  uVar11 = (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes;
  if (uVar11 == 3) {
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xb] = uVar16;
LAB_001b405e:
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[10] = uVar16;
  }
  else if (uVar11 == 2) goto LAB_001b405e;
  GVar5 = pTexInfo->TileMode;
  if ((pGVar12->TileInfo[GVar5].LogicalSize != 0) ||
     (((ulong)(pTexInfo->Flags).Gpu & 0x20000000000) != 0)) {
    uVar24 = (ulong)pGVar12->TileInfo[GVar5].LogicalTileWidth;
    uVar18 = (ulong)pGVar12->TileInfo[GVar5].LogicalTileHeight;
    if ((0x10 < (int)(pGVar12->Platform).eRenderCoreFamily) &&
       ((((ulong)(pTexInfo->Flags).Gpu & 2) != 0 &&
        (pCVar7 = (this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
                  pGmmLibContext, ((pCVar7->SkuTable).field_1.field_0x3 & 2) == 0)))) {
      uVar26 = *(ulong *)&(pCVar7->WaTable).field_0x4;
      if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1040) == 0) {
        bVar14 = ((uVar26 >> 0x2f & 1) == 0) << 2 | 2;
        if ((uVar26 >> 0x2e & 1) != 0) {
          bVar14 = 0;
        }
      }
      else {
        bVar14 = ((uVar26 & 0xc00000000000) == 0) << 2;
      }
      uVar18 = uVar18 << bVar14;
    }
    lVar1 = uVar24 - 1;
    uVar24 = -uVar24;
    *pGVar21 = *pGVar21 + lVar1 & uVar24;
    lVar2 = uVar18 - 1;
    uVar18 = -uVar18;
    uVar26 = *pGVar19 + lVar2 & uVar18;
    *pGVar19 = uVar26;
    *pGVar23 = lVar1 + *pGVar23 & uVar24;
    if (bVar27) {
      uVar24 = *local_38 + lVar2 & uVar18;
    }
    else {
      uVar24 = (uVar16 + lVar2 & uVar18) + (lVar2 + uVar13 & uVar18);
    }
    *local_38 = uVar24;
    if ((~(ulong)(pTexInfo->Flags).Gpu & 0x22000000000) == 0) {
      uVar26 = uVar26 + (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5];
      *pGVar19 = uVar26;
      *local_38 = uVar26;
    }
    if (((((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
          pGmmLibContext)->SkuTable).field_1.field_0x3 & 0x10) != 0) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xd] = uVar13 + lVar2 & uVar18;
      uVar11 = (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes;
      if (uVar11 == 3) {
        uVar18 = lVar2 + uVar16 & uVar18;
        (pTexInfo->OffsetInfo).field_0.Texture2DOffsetInfo.Offset[0xe] = uVar18;
      }
      else {
        if (uVar11 != 2) goto LAB_001b41c2;
        uVar18 = lVar2 + uVar16 & uVar18;
      }
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xe] = uVar18;
    }
  }
LAB_001b41c2:
  if (((~(ulong)(pTexInfo->Flags).Gpu & 0x2000010000) == 0) &&
     (((pTexInfo->Flags).Info.field_0x4 & 0x10) != 0)) {
    pPVar8 = ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
             pGmmLibContext)->pPlatformInfo;
    uVar16 = (ulong)(pPVar8->Data).TileInfo[pTexInfo->TileMode].LogicalTileWidth;
    uVar13 = (ulong)(pPVar8->Data).TileInfo[pTexInfo->TileMode].LogicalTileHeight;
    lVar1 = uVar16 - 1;
    uVar16 = -uVar16;
    *pGVar21 = *pGVar21 + lVar1 & uVar16;
    lVar2 = uVar13 - 1;
    uVar13 = -uVar13;
    *pGVar19 = *pGVar19 + lVar2 & uVar13;
    *pGVar23 = lVar1 + *pGVar23 & uVar16;
    *local_38 = lVar2 + *local_38 & uVar13;
  }
  return;
switchD_001b3e19_caseD_155:
  uVar13 = 0;
  uVar16 = 0;
  goto LAB_001b4038;
}

Assistant:

void GmmLib::GmmGen11TextureCalc::FillPlanarOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_GFX_SIZE_T *pUOffsetX, *pUOffsetY;
    GMM_GFX_SIZE_T *pVOffsetX, *pVOffsetY;
    uint32_t        YHeight = 0, VHeight = 0;
    bool            UVPacked = false;
    uint32_t        Height;
    uint32_t        WidthBytesPhysical = GFX_ULONG_CAST(pTexInfo->BaseWidth) * pTexInfo->BitsPerPixel >> 3;

#define SWAP_UV()              \
    {                          \
        GMM_GFX_SIZE_T *pTemp; \
                               \
        pTemp     = pUOffsetX; \
        pUOffsetX = pVOffsetX; \
        pVOffsetX = pTemp;     \
                               \
        pTemp     = pUOffsetY; \
        pUOffsetY = pVOffsetY; \
        pVOffsetY = pTemp;     \
    }

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);
    __GMM_ASSERTPTR(((pTexInfo->TileMode < GMM_TILE_MODES) && (pTexInfo->TileMode >= TILE_NONE)), VOIDRETURN);
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // GMM_PLANE_Y always at (0, 0)...
    pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_Y] = 0;
    pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y] = 0;

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = 0;
    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = 0;

    Height = pTexInfo->BaseHeight;
    if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        Height = __GMM_EXPAND_HEIGHT(this, Height, pTexInfo->Alignment.VAlign, pTexInfo);
        Height = ScaleTextureHeight(pTexInfo, Height);
        if(pTexInfo->Flags.Gpu.UnifiedAuxSurface)
        {
            pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y] = 0;
        }
    }

    // GMM_PLANE_U/V Planes...
    pUOffsetX = &pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_U];
    pUOffsetY = &pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U];
    pVOffsetX = &pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_V];
    pVOffsetY = &pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_V];

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1:
            SWAP_UV(); // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420:  // Same as IMC3.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUUUUUU
                                          // UUUUUUUU
                                          // VVVVVVVV
                                          // VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY =
                GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) +
                GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //UUUUUUUU
                                               //VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY =
                GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) +
                GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411:  // Similar to IMC3 but U/V are quarter width and full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UU
                                          // UU
                                          // UU
                                          // UU
                                          // VV
                                          // VV
                                          // VV
                                          // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // VVVVVVVV
                                         // VVVVVVVV
                                         // VVVVVVVV
                                         // VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) * 2;

                break;
            }
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        {
            //For RGBP linear Tile keep resource Offset non aligned and for other Tile format to be 16-bit aligned
            if(pTexInfo->Flags.Info.Linear)
            {
                *pUOffsetX = 0;
                YHeight    = pTexInfo->BaseHeight;
                *pUOffsetY = pTexInfo->BaseHeight;

                *pVOffsetX = 0;
                VHeight    = pTexInfo->BaseHeight;
                *pVOffsetY = (GMM_GFX_SIZE_T)pTexInfo->BaseHeight * 2;
            }
            else //Tiled
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY = (GMM_GFX_SIZE_T)GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) * 2;
            }
            break;
        }
        case GMM_FORMAT_IMC2:
            SWAP_UV(); // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            __GMM_ASSERT((pTexInfo->Pitch & 1) == 0);

            *pUOffsetX = 0;
            YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

            *pVOffsetX = pTexInfo->Pitch / 2;
            VHeight    = GFX_CEIL_DIV(YHeight, 2);
            *pVOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

            // Not technically UV packed but sizing works out the same
            UVPacked = true;

            break;
        }
        case GMM_FORMAT_I420: // I420 = IYUV
        case GMM_FORMAT_IYUV:
            SWAP_UV(); // I420/IYUV = YV12 with Swapped U/V
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, YVSizeRShift, VSize, UOffset;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = GFX_ULONG_CAST(pTexInfo->Pitch) * pTexInfo->BaseHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(GFX_ULONG_CAST(pTexInfo->Pitch), YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(pTexInfo->BaseHeight, YSizeForUVPurposesDimensionalAlignment);

            VSize   = (YSizeForUVPurposes >> YVSizeRShift);
            UOffset = YSize + VSize;

            *pVOffsetX = 0;
            *pVOffsetY = pTexInfo->BaseHeight;

            *pUOffsetX = UOffset % pTexInfo->Pitch;
            *pUOffsetY = UOffset / pTexInfo->Pitch;

            YHeight = GFX_CEIL_DIV(YSize + 2 * VSize, WidthBytesPhysical);

            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]
            *pUOffsetX = *pVOffsetX = 0;
            YHeight                 = GFX_ALIGN(Height, __GMM_EVEN_ROW);
            *pUOffsetY = *pVOffsetY = YHeight;

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(Height, 2);
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
            }

            UVPacked = true;
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unknown Video Format U\n");
            break;
        }
    }

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = YHeight;
    if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] = VHeight;
    }
    else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] =
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_V] = VHeight;
    }

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]) || pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        GMM_GFX_SIZE_T TileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        GMM_GFX_SIZE_T TileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
        GMM_GFX_SIZE_T PhysicalTileHeight = TileHeight;
        if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) > IGFX_GEN11LP_CORE)
        {
            if(pTexInfo->Flags.Gpu.CCS && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS)
            {
                //U/V must be aligned to AuxT granularity, 4x pitchalign enforces 16K-align for 4KB tile,
                //add extra padding for 64K AuxT, 1MB AuxT
                if(GMM_IS_64KB_TILE(pTexInfo->Flags))
                {
                    TileHeight *= (!WA64K(pGmmLibContext) && !WA16K(pGmmLibContext)) ? 16 : 1; // For 64Kb Tile mode: Multiply TileHeight by 16 for 1 MB alignment
                }
                else
                {
                    PhysicalTileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 1); //  for 1 MB AuxT granularity, we do 1 MB alignment only in VA space and not in physical space, so do not multiply PhysicalTileHeight with 64 here
                    TileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 64);        // For 4k Tile:  Multiply TileHeight by 4 and Pitch by 4 for 64kb alignment, multiply TileHeight by 64 and Pitch by 4 for 1 MB alignment
                }
            }
        }

        *pUOffsetX = GFX_ALIGN(*pUOffsetX, TileWidth);
        *pUOffsetY = GFX_ALIGN(*pUOffsetY, TileHeight);
        *pVOffsetX = GFX_ALIGN(*pVOffsetX, TileWidth);
        *pVOffsetY = UVPacked ?
                     GFX_ALIGN(*pVOffsetY, TileHeight) :
                     GFX_ALIGN(YHeight, TileHeight) + GFX_ALIGN(VHeight, TileHeight);

        if(pTexInfo->Flags.Gpu.UnifiedAuxSurface && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            *pUOffsetY += pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y];
            *pVOffsetY = *pUOffsetY;
        }

        // This is needed for FtrDisplayPageTables
        if(pGmmLibContext->GetSkuTable().FtrDisplayPageTables)
        {
            pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_Y] = GFX_ALIGN(YHeight, TileHeight);
            if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
            {
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_U] = GFX_ALIGN(VHeight, TileHeight);
            }
            else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
            {
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_U] =
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_V] = GFX_ALIGN(VHeight, TileHeight);
            }
        }
    }

    //Special case LKF MMC compressed surfaces
    if(pTexInfo->Flags.Gpu.MMC &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       pTexInfo->Flags.Info.TiledY)
    {
        GMM_GFX_SIZE_T TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        GMM_GFX_SIZE_T TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        *pUOffsetX = GFX_ALIGN(*pUOffsetX, TileWidth);
        *pUOffsetY = GFX_ALIGN(*pUOffsetY, TileHeight);
        *pVOffsetX = GFX_ALIGN(*pVOffsetX, TileWidth);
        *pVOffsetY = GFX_ALIGN(*pVOffsetY, TileHeight);
    }

    GMM_DPF_EXIT;

#undef SWAP_UV
}